

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t argumentCount_00;
  anon_struct_56_7_e267023e gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  ulong *local_178;
  sysbvm_tuple_t *psStack_170;
  sysbvm_tuple_t local_168;
  sysbvm_tuple_t sStack_160;
  sysbvm_tuple_t local_158;
  sysbvm_tuple_t sStack_150;
  sysbvm_tuple_t local_148;
  sysbvm_stackFrameRecord_t local_140;
  undefined8 local_130;
  sysbvm_stackFrameRecord_t local_128;
  undefined8 local_118;
  undefined1 *puStack_110;
  sysbvm_functionCallFrameStack_t local_108;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  anon_struct_136_2_7a050327_for_gcRoots *paStack_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_158 = 0;
  sStack_150 = 0;
  local_168 = 0;
  sStack_160 = 0;
  local_178 = (ulong *)0x0;
  psStack_170 = (sysbvm_tuple_t *)0x0;
  local_148 = 0;
  local_128.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_128._12_4_ = 0;
  local_118 = 7;
  puStack_110 = (undefined1 *)&local_178;
  sysbvm_stackFrame_pushRecord(&local_128);
  local_140.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_140.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_130 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_140);
  local_178 = (ulong *)sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  uVar4 = (ulong)local_178 & 0xf;
  if (uVar4 == 0 && local_178 != (ulong *)0x0) {
    psStack_170 = (sysbvm_tuple_t *)*local_178;
  }
  else if ((int)uVar4 == 0xf) {
    psStack_170 = (sysbvm_tuple_t *)
                  sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_178 >> 4);
  }
  else {
    psStack_170 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
  }
  uVar4 = (ulong)psStack_170 & 0xf;
  if (uVar4 == 0 && psStack_170 != (sysbvm_tuple_t *)0x0) {
    sVar1 = *psStack_170;
  }
  else if ((int)uVar4 == 0xf) {
    sVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_170 >> 4);
  }
  else {
    sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
  }
  local_168 = sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction
                        (context,sVar1);
  if (local_168 != 0) {
    local_108._8_8_ = *arguments;
    local_108.variadicArgumentIndex = arguments[1];
    local_108.applicationFlags = (sysbvm_bitflags_t)psStack_170;
    local_108.expectedArgumentCount = (size_t)local_178;
    local_148 = sysbvm_function_apply(context,local_168,4,&local_108.applicationFlags,0);
    sysbvm_stackFrame_popRecord(&local_140);
    sysbvm_stackFrame_popRecord(&local_128);
    return local_148;
  }
  if (((ulong)local_178 & 0xf) == 0 && local_178 != (ulong *)0x0) {
    uVar4 = *local_178;
    if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
      uVar4 = *(ulong *)(uVar4 + 0x70);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar2 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar2 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
    }
    else {
      uVar2 = 0;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      uVar4 = local_178[5];
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar4 = (long)uVar4 >> 4;
      }
      else {
        uVar4 = *(ulong *)(uVar4 + 0x10);
      }
      goto LAB_001234f0;
    }
  }
  uVar4 = 0;
LAB_001234f0:
  if ((uVar4 & 1) == 0) {
    argumentCount_00 = 0;
    memset(&local_108,0,0xb0);
    local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_58._12_4_ = 0;
    local_48 = 0x11;
    paStack_40 = &local_108.gcRoots;
    sysbvm_stackFrame_pushRecord(&local_58);
    uVar4 = *(ulong *)(*arguments + 0x30);
    if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
      argumentCount_00 = (size_t)(*(uint *)(uVar4 + 0xc) >> 3);
    }
    sysbvm_functionCallFrameStack_begin
              (context,&local_108,(sysbvm_tuple_t)local_178,argumentCount_00,0);
    if (argumentCount_00 != 0) {
      sVar3 = 0;
      do {
        uVar4 = *(ulong *)(*arguments + 0x30);
        if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
          local_158 = *(sysbvm_tuple_t *)(uVar4 + 0x10 + sVar3 * 8);
        }
        else {
          local_158 = 0;
        }
        sStack_150 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                               (context,local_158,arguments[1]);
        sysbvm_functionCallFrameStack_push(&local_108,sStack_150);
        sVar3 = sVar3 + 1;
      } while (argumentCount_00 != sVar3);
    }
    sysbvm_stackFrame_popRecord(&local_140);
    sysbvm_stackFrame_popRecord(&local_128);
    sVar1 = sysbvm_functionCallFrameStack_finish(context,&local_108);
  }
  else {
    sStack_160 = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
                           (context,arguments,(sysbvm_tuple_t *)&local_178,arguments + 1);
    sysbvm_stackFrame_popRecord(&local_140);
    sysbvm_stackFrame_popRecord(&local_128);
    sVar1 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sStack_160,arguments[1])
    ;
  }
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    struct {
        sysbvm_tuple_t functionOrMacro;
        sysbvm_tuple_t functionOrMacroExpressionType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedNode)->super.sourcePosition);

    gcFrame.functionOrMacro = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*unexpandedNode)->functionOrMacroExpression, *environment);
    gcFrame.functionOrMacroExpressionType = sysbvm_tuple_getType(context, gcFrame.functionOrMacro);
    gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.functionOrMacroExpressionType));
    if(gcFrame.analysisFunction)
    {
        gcFrame.result = sysbvm_function_apply4(context, gcFrame.analysisFunction, gcFrame.functionOrMacroExpressionType, (sysbvm_tuple_t)*unexpandedNode, gcFrame.functionOrMacro, *environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }

    bool isMacro = sysbvm_function_isMacro(context, gcFrame.functionOrMacro);
    if(isMacro)
    {
        gcFrame.expansionResult = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(context, node, &gcFrame.functionOrMacro, environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    size_t applicationArgumentCount = sysbvm_array_getSize((*unexpandedNode)->arguments);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.functionOrMacro, applicationArgumentCount, 0);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*unexpandedNode)->arguments, i);
        gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
    }

    //SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}